

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall olc::PixelGameEngine::olc_UpdateMouse(PixelGameEngine *this,int32_t x,int32_t y)

{
  vi2d vVar1;
  int iVar2;
  int iVar3;
  vi2d vVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  this->bHasMouseFocus = true;
  vVar1.y = y;
  vVar1.x = x;
  this->vMouseWindowPos = vVar1;
  vVar4.x = (this->vViewPos).x;
  vVar4.y = (this->vViewPos).y;
  auVar5._0_4_ = (float)(x - vVar4.x);
  auVar5._4_4_ = (float)(y - vVar4.y);
  auVar5._8_8_ = 0;
  auVar6._0_4_ = (float)((this->vWindowSize).x + vVar4.x * -2);
  auVar6._4_4_ = (float)((this->vWindowSize).y + vVar4.y * -2);
  auVar6._8_8_ = 0;
  auVar6 = divps(auVar5,auVar6);
  iVar2 = (this->vScreenSize).x;
  iVar3 = (this->vScreenSize).y;
  vVar4.x = (int)((float)iVar2 * auVar6._0_4_);
  vVar4.y = (int)((float)iVar3 * auVar6._4_4_);
  this->vMousePosCache = vVar4;
  if (iVar2 <= vVar4.x) {
    vVar4.x = iVar2 + -1;
    (this->vMousePosCache).x = vVar4.x;
  }
  if (iVar3 <= vVar4.y) {
    vVar4.y = iVar3 + -1;
    (this->vMousePosCache).y = vVar4.y;
  }
  if (vVar4.x < 0) {
    (this->vMousePosCache).x = 0;
  }
  if (-1 < vVar4.y) {
    return;
  }
  (this->vMousePosCache).y = 0;
  return;
}

Assistant:

void PixelGameEngine::olc_UpdateMouse(int32_t x, int32_t y)
	{
		// Mouse coords come in screen space
		// But leave in pixel space
		bHasMouseFocus = true;
		vMouseWindowPos = { x, y };
		// Full Screen mode may have a weird viewport we must clamp to
		x -= vViewPos.x;
		y -= vViewPos.y;
		vMousePosCache.x = (int32_t)(((float)x / (float)(vWindowSize.x - (vViewPos.x * 2)) * (float)vScreenSize.x));
		vMousePosCache.y = (int32_t)(((float)y / (float)(vWindowSize.y - (vViewPos.y * 2)) * (float)vScreenSize.y));
		if (vMousePosCache.x >= (int32_t)vScreenSize.x)	vMousePosCache.x = vScreenSize.x - 1;
		if (vMousePosCache.y >= (int32_t)vScreenSize.y)	vMousePosCache.y = vScreenSize.y - 1;
		if (vMousePosCache.x < 0) vMousePosCache.x = 0;
		if (vMousePosCache.y < 0) vMousePosCache.y = 0;
	}